

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

Reg asm_setup_call_slots(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  int iVar1;
  Reg RVar2;
  bool bVar3;
  IRRef local_128;
  int nslots;
  IRRef args [64];
  CCallInfo *ci_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  asm_collectargs(as,ir,ci,&local_128);
  iVar1 = asm_count_call_slots(as,ci,&local_128);
  if (as->evenspill < iVar1) {
    as->evenspill = iVar1;
  }
  bVar3 = true;
  if (((ir->field_1).t.irt & 0x1f) != 0xe) {
    bVar3 = ((ir->field_1).t.irt & 0x1f) == 0xd;
  }
  RVar2 = 0x80;
  if (bVar3) {
    RVar2 = 0x90;
  }
  return RVar2;
}

Assistant:

static Reg asm_setup_call_slots(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  IRRef args[CCI_NARGS_MAX*2];
  int nslots;
  asm_collectargs(as, ir, ci, args);
  nslots = asm_count_call_slots(as, ci, args);
  if (nslots > as->evenspill)  /* Leave room for args in stack slots. */
    as->evenspill = nslots;
#if LJ_64
  return irt_isfp(ir->t) ? REGSP_HINT(RID_FPRET) : REGSP_HINT(RID_RET);
#else
  return irt_isfp(ir->t) ? REGSP_INIT : REGSP_HINT(RID_RET);
#endif
}